

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::NullTypeHandlerBase::HasProperty
          (NullTypeHandlerBase *this,DynamicObject *instance,JavascriptString *propertyNameString)

{
  JavascriptString *instance_00;
  PropertyId propertyId;
  BOOL BVar1;
  ScriptContext *this_00;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  JavascriptString *propertyNameString_local;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  propertyRecord = (PropertyRecord *)propertyNameString;
  propertyNameString_local = (JavascriptString *)instance;
  instance_local = (DynamicObject *)this;
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  ScriptContext::GetOrAddPropertyRecord(this_00,(JavascriptString *)propertyRecord,&local_28);
  instance_00 = propertyNameString_local;
  propertyId = PropertyRecord::GetPropertyId(local_28);
  BVar1 = HasProperty(this,(DynamicObject *)instance_00,propertyId,(bool *)0x0,
                      (PropertyValueInfo *)0x0);
  return BVar1;
}

Assistant:

BOOL NullTypeHandlerBase::HasProperty(DynamicObject* instance, JavascriptString* propertyNameString)
    {
        PropertyRecord const* propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return NullTypeHandlerBase::HasProperty(instance, propertyRecord->GetPropertyId());
    }